

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# broadcast_socket.cpp
# Opt level: O2

bool libtorrent::is_link_local(address *a)

{
  bool bVar1;
  address_v4 a4;
  anon_union_16_3_a3f0114d_for___in6_u local_20;
  
  if (a->type_ == ipv6) {
    boost::asio::ip::address::to_v6((address_v6 *)&local_20,a);
    bVar1 = true;
    if ((local_20.__u6_addr8[1] & 0xc0) != 0x80 || local_20.__u6_addr8[0] != 0xfe) {
      bVar1 = (local_20.__u6_addr8[1] & 0xf) == 2 && local_20.__u6_addr8[0] == 0xff;
    }
  }
  else {
    boost::asio::ip::address::to_v4((address *)&local_20);
    bVar1 = local_20.__u6_addr16[0] == 0xfea9;
  }
  return bVar1;
}

Assistant:

bool is_link_local(address const& a)
	{
		if (a.is_v6())
		{
			address_v6 const a6 = a.to_v6();
			return a6.is_link_local()
				|| a6.is_multicast_link_local();
		}
		address_v4 const a4 = a.to_v4();
		unsigned long ip = a4.to_ulong();
		return (ip & 0xffff0000) == 0xa9fe0000; // 169.254.x.x
	}